

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCACore.cpp
# Opt level: O0

HRESULT Js::SCACore::ValidateTransferableVars(Var *vars,size_t count)

{
  Var aValue;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  RecyclableObject *this;
  ulong uStack_40;
  TypeId typeId;
  size_t i;
  size_t count_local;
  Var *vars_local;
  TypeId local_18;
  TypeId typeId_1;
  
  uStack_40 = 0;
  while( true ) {
    if (count <= uStack_40) {
      return 0;
    }
    aValue = vars[uStack_40];
    if (aValue == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/SCACore/../Runtime/Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    bVar2 = TaggedInt::Is(aValue);
    if (bVar2) {
      local_18 = TypeIds_FirstNumberType;
    }
    else {
      bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(aValue);
      if (bVar2) {
        local_18 = TypeIds_Number;
      }
      else {
        this = UnsafeVarTo<Js::RecyclableObject>(aValue);
        if (this == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/SCACore/../Runtime/Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
        local_18 = RecyclableObject::GetTypeId(this);
        if ((0x57 < (int)local_18) && (BVar3 = RecyclableObject::IsExternal(this), BVar3 == 0)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/SCACore/../Runtime/Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
      }
    }
    if (local_18 != TypeIds_ArrayBuffer) break;
    bVar2 = Js::JavascriptOperators::IsObjectDetached(vars[uStack_40]);
    if (bVar2) {
      return -0x7ffbeffc;
    }
    uStack_40 = uStack_40 + 1;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar4 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/SCACore/SCACore.cpp"
                              ,0x14,"(false)","These should have been filtered out by the host.");
  if (bVar2) {
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
    return -0x7ffbeffd;
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

HRESULT ValidateTransferableVars(Var *vars, size_t count)
        {
            for (size_t i = 0; i < count; i++)
            {
                Js::TypeId typeId = Js::JavascriptOperators::GetTypeId(vars[i]);
                if (typeId != TypeIds_ArrayBuffer)
                {

                    AssertMsg(false, "These should have been filtered out by the host.");
                    return E_SCA_TRANSFERABLE_UNSUPPORTED;
                }

                if (Js::JavascriptOperators::IsObjectDetached(vars[i]))
                {
                    return E_SCA_TRANSFERABLE_NEUTERED;
                }
            }
            return S_OK;
        }